

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O2

void __thiscall
xray_re::xr_mesh_vbuf::transform_points
          (xr_mesh_vbuf *this,fvector3 *source,fvector3 *target,size_t size,fmatrix *xform)

{
  _vector3<double> *v;
  bool bVar1;
  dmatrix m;
  anon_union_24_2_77b31271_for__vector3<double>_1 local_c8;
  _matrix<double> local_a8;
  
  _matrix<double>::set<float>(&local_a8,xform);
  while (bVar1 = size != 0, size = size - 1, bVar1) {
    local_c8.field_0.x = (double)(float)*(undefined8 *)&source->field_0;
    local_c8.field_0.y = (double)(float)((ulong)*(undefined8 *)&source->field_0 >> 0x20);
    local_c8.field_0.z = (double)(source->field_0).field_0.z;
    v = _vector3<double>::transform((_vector3<double> *)&local_c8.field_0,&local_a8);
    _vector3<float>::set<double>(target,v);
    target = target + 1;
    source = source + 1;
  }
  return;
}

Assistant:

void xr_mesh_vbuf::transform_points(const fvector3* source, fvector3* target, size_t size,
		const fmatrix& xform) const
{
	dmatrix m;
	m.set(xform);
	for (; size != 0; --size, ++target)
		target->set(dvector3().set(*source++).transform(m));
}